

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

int cmsys::regmatch(char *prog)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  byte *p;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  byte *pbVar9;
  long lVar10;
  byte *__s2;
  
  pbVar9 = regbol;
  __s2 = reginput;
switchD_0014554b_caseD_7:
  p = (byte *)prog;
  if (p == (byte *)0x0) {
    pcVar7 = "RegularExpression::find(): Internal error -- corrupted pointers.";
    goto LAB_00145635;
  }
  prog = regnext((char *)p);
  pbVar2 = reginput;
  bVar1 = *p;
  uVar6 = (ulong)bVar1;
  switch(uVar6) {
  case 0:
    goto switchD_0014554b_caseD_0;
  case 1:
    if (__s2 != pbVar9) {
      return 0;
    }
    goto switchD_0014554b_caseD_7;
  case 2:
    if (*__s2 != 0) {
      return 0;
    }
    goto switchD_0014554b_caseD_7;
  case 3:
    if (*__s2 == 0) {
      return 0;
    }
    break;
  case 4:
    if (*__s2 == 0) {
      return 0;
    }
    pcVar7 = strchr((char *)(p + 3),(int)(char)*__s2);
    if (pcVar7 == (char *)0x0) {
      return 0;
    }
    break;
  case 5:
    if (*__s2 == 0) {
      return 0;
    }
    pcVar7 = strchr((char *)(p + 3),(int)(char)*__s2);
    if (pcVar7 != (char *)0x0) {
      return 0;
    }
    break;
  case 6:
    if (*prog == 6) goto LAB_0014570c;
    prog = (char *)(p + 3);
  case 7:
  case 9:
    goto switchD_0014554b_caseD_7;
  case 8:
    if (p[3] != *__s2) {
      return 0;
    }
    sVar4 = strlen((char *)(p + 3));
    if ((1 < sVar4) && (iVar3 = strncmp((char *)(p + 3),(char *)__s2,sVar4), iVar3 != 0)) {
      return 0;
    }
    __s2 = __s2 + sVar4;
    reginput = __s2;
    goto switchD_0014554b_caseD_7;
  case 10:
  case 0xb:
    bVar8 = 0;
    if (*prog == 8) {
      bVar8 = ((byte *)prog)[3];
    }
    if (p[3] - 3 < 6) {
      pbVar9 = p + 6;
      switch((uint)p[3]) {
      case 3:
        sVar5 = strlen((char *)reginput);
        sVar4 = (size_t)(int)sVar5;
        break;
      case 4:
        sVar4 = 0;
        while ((sVar5 = sVar4, pbVar2[sVar4] != 0 &&
               (pcVar7 = strchr((char *)pbVar9,(int)(char)pbVar2[sVar4]), pcVar7 != (char *)0x0))) {
          sVar4 = sVar4 + 1;
        }
        break;
      case 5:
        sVar4 = 0;
        while ((sVar5 = sVar4, pbVar2[sVar4] != 0 &&
               (pcVar7 = strchr((char *)pbVar9,(int)(char)pbVar2[sVar4]), pcVar7 == (char *)0x0))) {
          sVar4 = sVar4 + 1;
        }
        break;
      default:
        goto switchD_001456e2_caseD_6;
      case 8:
        for (sVar4 = 0; sVar5 = sVar4, *pbVar9 == reginput[sVar4]; sVar4 = sVar4 + 1) {
        }
      }
      reginput = pbVar2 + sVar4;
      lVar10 = (long)(int)sVar5;
    }
    else {
switchD_001456e2_caseD_6:
      puts("cm RegularExpression::find(): Internal error.");
      lVar10 = 0;
    }
    while( true ) {
      if (lVar10 < (long)(ulong)(bVar1 != 10)) {
        return 0;
      }
      if (((bVar8 == 0) || (bVar8 == *reginput)) && (iVar3 = regmatch(prog), iVar3 != 0)) break;
      reginput = pbVar2 + lVar10 + -1;
      lVar10 = lVar10 + -1;
    }
    return 1;
  default:
    pcVar7 = "RegularExpression::find(): Internal error -- memory corrupted.";
LAB_00145635:
    puts(pcVar7);
    return 0;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    iVar3 = regmatch(prog);
    if (iVar3 == 0) {
      return 0;
    }
    if (*(long *)(regstartp + -0xa0 + uVar6 * 8) != 0) {
      return 1;
    }
    *(byte **)(regstartp + -0xa0 + uVar6 * 8) = pbVar2;
    return 1;
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    iVar3 = regmatch(prog);
    if (iVar3 == 0) {
      return 0;
    }
    if (*(long *)(regendp + -0xf0 + uVar6 * 8) == 0) {
      *(byte **)(regendp + -0xf0 + uVar6 * 8) = pbVar2;
    }
    goto switchD_0014554b_caseD_0;
  }
  __s2 = __s2 + 1;
  reginput = __s2;
  goto switchD_0014554b_caseD_7;
LAB_0014570c:
  while (iVar3 = regmatch((char *)(p + 3)), iVar3 == 0) {
    reginput = pbVar2;
    p = (byte *)regnext((char *)p);
    if ((p == (byte *)0x0) || (*p != 6)) {
      return 0;
    }
  }
switchD_0014554b_caseD_0:
  return 1;
}

Assistant:

static int regmatch (const char* prog) {
    const char* scan;  // Current node.
    const char* next;  // Next node.

    scan = prog;

    while (scan != 0) {

        next = regnext(scan);

        switch (OP(scan)) {
            case BOL:
                if (reginput != regbol)
                    return (0);
                break;
            case EOL:
                if (*reginput != '\0')
                    return (0);
                break;
            case ANY:
                if (*reginput == '\0')
                    return (0);
                reginput++;
                break;
            case EXACTLY:{
                    size_t len;
                    const char* opnd;

                    opnd = OPERAND(scan);
                    // Inline the first character, for speed.
                    if (*opnd != *reginput)
                        return (0);
                    len = strlen(opnd);
                    if (len > 1 && strncmp(opnd, reginput, len) != 0)
                        return (0);
                    reginput += len;
                }
                break;
            case ANYOF:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == 0)
                    return (0);
                reginput++;
                break;
            case ANYBUT:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != 0)
                    return (0);
                reginput++;
                break;
            case NOTHING:
                break;
            case BACK:
                break;
            case OPEN + 1:
            case OPEN + 2:
            case OPEN + 3:
            case OPEN + 4:
            case OPEN + 5:
            case OPEN + 6:
            case OPEN + 7:
            case OPEN + 8:
            case OPEN + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - OPEN;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set startp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regstartp[no] == 0)
                            regstartp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case CLOSE + 1:
            case CLOSE + 2:
            case CLOSE + 3:
            case CLOSE + 4:
            case CLOSE + 5:
            case CLOSE + 6:
            case CLOSE + 7:
            case CLOSE + 8:
            case CLOSE + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - CLOSE;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set endp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regendp[no] == 0)
                            regendp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case BRANCH:{

              const char* save;

                    if (OP(next) != BRANCH)     // No choice.
                        next = OPERAND(scan);   // Avoid recursion.
                    else {
                        do {
                            save = reginput;
                            if (regmatch(OPERAND(scan)))
                                return (1);
                            reginput = save;
                            scan = regnext(scan);
                        } while (scan != 0 && OP(scan) == BRANCH);
                        return (0);
                        // NOTREACHED
                    }
                }
                break;
            case STAR:
            case PLUS:{
                    char   nextch;
                    int        no;
                    const char* save;
                    int        min_no;

                    //
                    // Lookahead to avoid useless match attempts when we know
                    // what character comes next.
                    //
                    nextch = '\0';
                    if (OP(next) == EXACTLY)
                        nextch = *OPERAND(next);
                    min_no = (OP(scan) == STAR) ? 0 : 1;
                    save = reginput;
                    no = regrepeat(OPERAND(scan));
                    while (no >= min_no) {
                        // If it could work, try it.
                        if (nextch == '\0' || *reginput == nextch)
                            if (regmatch(next))
                                return (1);
                        // Couldn't or didn't -- back up.
                        no--;
                        reginput = save + no;
                    }
                    return (0);
                }
//              break;
            case END:
                return (1);     // Success!

            default:
                //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
                printf ("RegularExpression::find(): Internal error -- memory corrupted.\n");
                return 0;
        }
        scan = next;
    }

    //
    //  We get here only if there's trouble -- normally "case END" is the
    //  terminating point.
    //
    //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf ("RegularExpression::find(): Internal error -- corrupted pointers.\n");
    return (0);
}